

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

void Cnf_SopConvertToVector(char *pSop,int nCubes,Vec_Int_t *vCover)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint Entry;
  ulong uVar4;
  ulong uVar5;
  int Lits [4];
  
  vCover->nSize = 0;
  uVar4 = 0;
  uVar5 = (ulong)(uint)nCubes;
  if (nCubes < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    iVar1 = (int)pSop[uVar4];
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      iVar3 = (uint)(iVar1 % 3 == 1) * 2;
      if (iVar1 % 3 == 0) {
        iVar3 = 1;
      }
      Lits[lVar2] = iVar3;
      iVar1 = iVar1 / 3;
    }
    Entry = 0;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      Entry = Entry << 2 | Lits[lVar2];
    }
    Vec_IntPush(vCover,Entry);
  }
  return;
}

Assistant:

void Cnf_SopConvertToVector( char * pSop, int nCubes, Vec_Int_t * vCover )
{
    int Lits[4], Cube, iCube, i, b;
    Vec_IntClear( vCover );
    for ( i = 0; i < nCubes; i++ )
    {
        Cube = pSop[i];
        for ( b = 0; b < 4; b++ )
        {
            if ( Cube % 3 == 0 )
                Lits[b] = 1;
            else if ( Cube % 3 == 1 )
                Lits[b] = 2;
            else
                Lits[b] = 0;
            Cube = Cube / 3;
        }
        iCube = 0;
        for ( b = 0; b < 4; b++ )
            iCube = (iCube << 2) | Lits[b];
        Vec_IntPush( vCover, iCube );
    }
}